

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarkContext.cpp
# Opt level: O3

uint __thiscall
Memory::MarkContext::Split(MarkContext *this,uint targetCount,MarkContext **targetContexts)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  undefined8 *in_FS_OFFSET;
  PageStack<Memory::MarkContext::MarkCandidate> *local_48;
  PageStack<Memory::MarkContext::MarkCandidate> *targetMarkStacks [3];
  
  if (2 < targetCount - 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MarkContext.cpp"
                       ,0x57,
                       "(targetCount > 0 && targetCount <= PageStack<MarkCandidate>::MaxSplitTargets && targetCount <= PageStack<IRecyclerVisitedObject*>::MaxSplitTargets)"
                       ,
                       "targetCount > 0 && targetCount <= PageStack<MarkCandidate>::MaxSplitTargets && targetCount <= PageStack<IRecyclerVisitedObject*>::MaxSplitTargets"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
    if (targetCount == 0) goto LAB_002d0962;
  }
  uVar5 = 0;
  do {
    targetMarkStacks[uVar5 - 1] = &targetContexts[uVar5]->markStack;
    uVar5 = uVar5 + 1;
  } while (targetCount != uVar5);
LAB_002d0962:
  uVar4 = PageStack<Memory::MarkContext::MarkCandidate>::Split
                    (&this->markStack,targetCount,&local_48);
  return uVar4;
}

Assistant:

uint MarkContext::Split(uint targetCount, __in_ecount(targetCount) MarkContext ** targetContexts)
{
#pragma prefast(suppress:__WARNING_REDUNDANTTEST, "Due to implementation of the PageStack template this test may end up being redundant")
    Assert(targetCount > 0 && targetCount <= PageStack<MarkCandidate>::MaxSplitTargets && targetCount <= PageStack<IRecyclerVisitedObject*>::MaxSplitTargets);
    __analysis_assume(targetCount <= PageStack<MarkCandidate>::MaxSplitTargets);
    __analysis_assume(targetCount <= PageStack<IRecyclerVisitedObject*>::MaxSplitTargets);

    PageStack<MarkCandidate> * targetMarkStacks[PageStack<MarkCandidate>::MaxSplitTargets];
#ifdef RECYCLER_VISITED_HOST
    PageStack<IRecyclerVisitedObject*> * targetPreciseStacks[PageStack<IRecyclerVisitedObject*>::MaxSplitTargets];
#endif

    for (uint i = 0; i < targetCount; i++)
    {
        targetMarkStacks[i] = &targetContexts[i]->markStack;
#ifdef RECYCLER_VISITED_HOST
        targetPreciseStacks[i] = &targetContexts[i]->preciseStack;
#endif
    }

    // Return the max count of the two splits - since the stacks have more or less unrelated sizes, they
    // could yield different number of splits, but the caller wants to know the max parallelism it
    // should use on the results of the split.
    const uint markStackSplitCount = this->markStack.Split(targetCount, targetMarkStacks);
#ifdef RECYCLER_VISITED_HOST
    const uint preciseStackSplitCount = this->preciseStack.Split(targetCount, targetPreciseStacks);
    return max(markStackSplitCount, preciseStackSplitCount);
#else
    return markStackSplitCount;
#endif
}